

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

double vera::sqrt(double __x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  long *in_RDI;
  float extraout_XMM0_Da;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar6;
  
  iVar1 = (**(code **)(*in_RDI + 0x30))(SUB84(__x,0));
  iVar2 = (**(code **)(*in_RDI + 0x38))();
  iVar3 = (**(code **)(*in_RDI + 0x40))();
  iVar3 = iVar3 * iVar2 * iVar1;
  fVar5 = extraout_XMM0_Da;
  uVar6 = extraout_XMM0_Db;
  if (0 < iVar3) {
    iVar1 = 0;
    do {
      pfVar4 = (float *)(**(code **)(*in_RDI + 0x60))();
      fVar5 = *pfVar4;
      if (fVar5 < 0.0) {
        fVar5 = sqrtf(fVar5);
      }
      else {
        fVar5 = SQRT(fVar5);
      }
      pfVar4 = (float *)(**(code **)(*in_RDI + 0x60))();
      uVar6 = 0;
      *pfVar4 = fVar5;
      iVar1 = iVar1 + 1;
    } while (iVar3 != iVar1);
  }
  return (double)CONCAT44(uVar6,fVar5);
}

Assistant:

void sqrt(Image& _image) {
    int total = _image.getWidth() * _image.getHeight() * _image.getChannels();
    for (int i = 0; i < total; i++)
        _image[i] = std::sqrt(_image[i]);
}